

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O1

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BinaryDecoder *coder)

{
  uint8_t *puVar1;
  char *pcVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  FileInfo *pFVar6;
  ulong uVar7;
  uint n;
  StringList local_38;
  
  *(undefined8 *)((long)&this->valueData + 0x40) = 0;
  *(undefined8 *)((long)&this->valueData + 0x48) = 0;
  *(undefined8 *)((long)&this->valueData + 0x30) = 0;
  *(undefined8 *)((long)&this->valueData + 0x38) = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  this->kind = Invalid;
  this->numOutputInfos = 0;
  (this->signature).value = 0;
  (this->stringValues).contents = (char *)0x0;
  (this->stringValues).size = 0;
  if (coder->pos == (coder->data).Length) {
    this->kind = Invalid;
  }
  else {
    bVar3 = llbuild::basic::BinaryDecoder::read8(coder);
    this->kind = (uint)bVar3;
    if ((bVar3 < 0x12) && ((0x20060U >> (bVar3 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      uVar4 = llbuild::basic::BinaryDecoder::read32(coder);
      uVar5 = llbuild::basic::BinaryDecoder::read32(coder);
      (this->signature).value = CONCAT44(uVar5,uVar4);
    }
    if ((this->kind < (FilteredDirectoryContents|ExistingInput)) &&
       ((0x20414U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      uVar4 = llbuild::basic::BinaryDecoder::read32(coder);
      this->numOutputInfos = uVar4;
      if (1 < uVar4) {
        pFVar6 = (FileInfo *)operator_new__((ulong)uVar4 * 0x50);
        uVar7 = 0;
        do {
          puVar1 = (pFVar6->checksum).bytes + uVar7 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          puVar1 = (pFVar6->checksum).bytes + uVar7;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          uVar7 = uVar7 + 0x50;
        } while ((ulong)uVar4 * 0x50 != uVar7);
        (this->valueData).asOutputInfos = pFVar6;
      }
      if (this->numOutputInfos != 0) {
        n = 0;
        do {
          pFVar6 = getNthOutputInfo(this,n);
          llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::decode(pFVar6,coder);
          n = n + 1;
        } while (n != this->numOutputInfos);
      }
    }
    if ((this->kind < SuccessfulCommandWithOutputSignature) &&
       ((0x10090U >> (this->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      llbuild::basic::StringList::StringList(&local_38,coder);
      if (&this->stringValues != &local_38) {
        (this->stringValues).size = local_38.size;
        pcVar2 = (this->stringValues).contents;
        if (pcVar2 != (char *)0x0) {
          operator_delete__(pcVar2);
        }
        (this->stringValues).contents = local_38.contents;
        local_38.contents = (char *)0x0;
      }
      if (local_38.contents != (char *)0x0) {
        operator_delete__(local_38.contents);
      }
    }
    if (coder->pos != (coder->data).Length) {
      __assert_fail("isEmpty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/BinaryCoding.h"
                    ,0xd4,"void llbuild::basic::BinaryDecoder::finish()");
    }
  }
  return;
}

Assistant:

inline buildsystem::BuildValue::BuildValue(basic::BinaryDecoder& coder) {
  // Handle empty decode requests.
  if (coder.isEmpty()) {
    kind = BuildValue::Kind::Invalid;
    return;
  }
  
  coder.read(kind);
  if (kindHasSignature())
    coder.read(signature);
  if (kindHasOutputInfo()) {
    coder.read(numOutputInfos);
    if (numOutputInfos > 1) {
      valueData.asOutputInfos = new FileInfo[numOutputInfos];
    }
    for (uint32_t i = 0; i != numOutputInfos; ++i) {
      coder.read(getNthOutputInfo(i));
    }
  }
  if (kindHasStringList()) {
    stringValues = basic::StringList(coder);
  }
  coder.finish();
}